

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O2

int ini_find_section(ini_t *ini,char *name,int name_length)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__s2;
  ulong uVar5;
  
  if (name != (char *)0x0 && ini != (ini_t *)0x0) {
    if (name_length < 1) {
      name_length = sx_strlen(name);
    }
    uVar4 = 0;
    uVar5 = (ulong)(uint)ini->section_count;
    if (ini->section_count < 1) {
      uVar5 = uVar4;
    }
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      pcVar1 = *(char **)(ini->sections->name + uVar4 + 0x20);
      __s2 = ini->sections->name + uVar4;
      if (pcVar1 != (char *)0x0) {
        __s2 = pcVar1;
      }
      iVar2 = strncasecmp(name,__s2,(long)name_length);
      if (iVar2 == 0) {
        return (int)uVar3;
      }
      uVar4 = uVar4 + 0x28;
    }
  }
  return -1;
}

Assistant:

int ini_find_section( ini_t const* ini, char const* name, int name_length )
    {
    int i;

    if( ini && name )
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        for( i = 0; i < ini->section_count; ++i )
            {
            char const* const other = 
                ini->sections[ i ].name_large ? ini->sections[ i ].name_large : ini->sections[ i ].name;
            if( INI_STRNICMP( name, other, name_length ) == 0 )
                return i;
            }
        }

    return INI_NOT_FOUND;
    }